

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::Variable::declareArray
          (string *__return_storage_ptr__,Variable *this,string *sizeExpr)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0 [2];
  long local_1e0 [2];
  DeclareVariable local_1d0;
  undefined1 local_190 [376];
  
  glu::decl::DeclareVariable::DeclareVariable(&local_1d0,&this->m_type,&this->m_name,0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  glu::decl::operator<<((ostream *)local_190,&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  plVar2 = (long *)std::__cxx11::string::append((char *)local_1f0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_220 = *plVar3;
    lStack_218 = plVar2[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar3;
    local_230 = (long *)*plVar2;
  }
  local_228 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)(sizeExpr->_M_dataplus)._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_200 = *plVar3;
    lStack_1f8 = plVar2[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *plVar3;
    local_210 = (long *)*plVar2;
  }
  local_208 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_210);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0],local_1e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.name._M_dataplus._M_p != &local_1d0.name.field_2) {
    operator_delete(local_1d0.name._M_dataplus._M_p,local_1d0.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_1d0.varType);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::Variable::declareArray (const string& sizeExpr) const
{
	DE_ASSERT(m_isArray);
	return de::toString(glu::declare(m_type, m_name)) + "[" + sizeExpr + "];\n";
}